

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

JSValue js_function_toString(JSContext *ctx,JSValue this_val,int argc,JSValue *argv)

{
  long lVar1;
  int iVar2;
  char *str1;
  ulong uVar3;
  JSValue JVar4;
  
  iVar2 = check_function(ctx,this_val);
  if (iVar2 != 0) {
    JVar4 = (JSValue)(ZEXT816(6) << 0x40);
    uVar3 = 0;
    goto LAB_0015352a;
  }
  uVar3 = (ulong)*(ushort *)((long)this_val.u.ptr + 6);
  str1 = "function ";
  if ((uVar3 < 0x32) && ((0x2200000012000U >> (uVar3 & 0x3f) & 1) != 0)) {
    lVar1 = *(long *)((long)this_val.u.ptr + 0x30);
    if (((*(ushort *)(lVar1 + 0x19) >> 10 & 1) == 0) || (*(char **)(lVar1 + 0x78) == (char *)0x0)) {
      str1 = &DAT_00168cac + *(int *)(&DAT_00168cac + (*(ushort *)(lVar1 + 0x19) >> 2 & 0xc));
      goto LAB_001534e1;
    }
    JVar4 = JS_NewStringLen(ctx,*(char **)(lVar1 + 0x78),(long)*(int *)(lVar1 + 0x68));
  }
  else {
LAB_001534e1:
    JVar4 = JS_GetPropertyInternal(ctx,this_val,0x36,this_val,0);
    if ((int)JVar4.tag == 3) {
      JVar4 = JS_AtomToString(ctx,0x2f);
    }
    JVar4 = JS_ConcatString3(ctx,str1,JVar4,"() {\n    [native code]\n}");
  }
  uVar3 = (ulong)JVar4.u.ptr & 0xffffffff00000000;
LAB_0015352a:
  JVar4.u.ptr = (void *)(JVar4.u._0_4_ | uVar3);
  return JVar4;
}

Assistant:

static JSValue js_function_toString(JSContext *ctx, JSValueConst this_val,
                                    int argc, JSValueConst *argv)
{
    JSObject *p;
    JSFunctionKindEnum func_kind = JS_FUNC_NORMAL;

    if (check_function(ctx, this_val))
        return JS_EXCEPTION;

    p = JS_VALUE_GET_OBJ(this_val);
    if (js_class_has_bytecode(p->class_id)) {
        JSFunctionBytecode *b = p->u.func.function_bytecode;
        if (b->has_debug && b->debug.source) {
            return JS_NewStringLen(ctx, b->debug.source, b->debug.source_len);
        }
        func_kind = b->func_kind;
    }
    {
        JSValue name;
        const char *pref, *suff;

        switch(func_kind) {
        default:
        case JS_FUNC_NORMAL:
            pref = "function ";
            break;
        case JS_FUNC_GENERATOR:
            pref = "function *";
            break;
        case JS_FUNC_ASYNC:
            pref = "async function ";
            break;
        case JS_FUNC_ASYNC_GENERATOR:
            pref = "async function *";
            break;
        }
        suff = "() {\n    [native code]\n}";
        name = JS_GetProperty(ctx, this_val, JS_ATOM_name);
        if (JS_IsUndefined(name))
            name = JS_AtomToString(ctx, JS_ATOM_empty_string);
        return JS_ConcatString3(ctx, pref, name, suff);
    }
}